

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::BasicGLSLMiscFS::Run(BasicGLSLMiscFS *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  _Alloc_hider _Var1;
  bool bVar2;
  GLuint GVar3;
  TestLog **this_01;
  _Alloc_hider _Var4;
  ivec4 *extraout_RDX;
  ivec4 *extraout_RDX_00;
  Vector<int,_4> *v;
  Vector<int,_4> *v_00;
  ivec4 *extraout_RDX_01;
  ivec4 *b;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  string local_c8;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> o_data;
  vector<float,_std::allocator<float>_> data;
  undefined8 local_78;
  undefined8 uStack_70;
  string local_60;
  ShaderImageLoadStoreBase local_40 [16];
  
  bVar2 = ShaderImageLoadStoreBase::IsVSFSAvailable(&this->super_ShaderImageLoadStoreBase,0,2);
  lVar5 = 0x10;
  if (bVar2) {
    bVar2 = ShaderImageLoadStoreBase::IsSSBInVSFSAvailable(&this->super_ShaderImageLoadStoreBase,1);
    if (bVar2) {
      std::vector<float,_std::allocator<float>_>::vector(&data,0x1000,(allocator_type *)&local_c8);
      this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                 super_CallLogWrapper;
      textures = &this->m_texture;
      glu::CallLogWrapper::glGenTextures(this_00,1,textures);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,*textures);
      glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0x8c1a,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage3D(this_00,0x8c1a,1,0x822e,0x20,0x20,4);
      glu::CallLogWrapper::glTexSubImage3D
                (this_00,0x8c1a,0,0,0,0,0x20,0x20,4,0x1903,0x1406,
                 data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c1a,0);
      GVar3 = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,
                         "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                         ,
                         "\n#define KSIZE 32\nlayout(std430) buffer out_data {\n  ivec4 o_color[KSIZE*KSIZE];\n};\nlayout(r32f, binding = 0) coherent restrict uniform image2D g_image_layer0;\nlayout(r32f, binding = 1) volatile uniform image2D g_image_layer1;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_layer0, coord, vec4(1.0));\n  memoryBarrier();\n  imageStore(g_image_layer1, coord, vec4(2.0));\n  memoryBarrier();\n  imageStore(g_image_layer0, coord, vec4(3.0));\n  memoryBarrier();\n  int coordIndex = coord.x + KSIZE * coord.y;\n  o_color[coordIndex] = ivec4(imageLoad(g_image_layer0, coord) + imageLoad(g_image_layer1, coord));\n}"
                         ,false,false);
      this->m_program = GVar3;
      ShaderImageLoadStoreBase::CreateFullViewportQuad
                (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
      glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x822e);
      glu::CallLogWrapper::glBindImageTexture(this_00,1,*textures,0,'\0',1,0x88ba,0x822e);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glViewport(this_00,0,0,0x20,0x20);
      std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
                (&o_data,0x400,(allocator_type *)&local_c8);
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,0x4000,
                 o_data.
                 super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,0x88e4);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
      glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      _Var4._M_p = (pointer)0x4000;
      this_01 = (TestLog **)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x4000,1);
      bVar6 = 1;
      b = extraout_RDX;
      for (uVar7 = 0; uVar7 != 0x400; uVar7 = uVar7 + 1) {
        local_c8._M_dataplus._M_p = (pointer)0x5;
        local_c8._M_string_length = 0x200000000;
        bVar2 = ShaderImageLoadStoreBase::Equal
                          ((ShaderImageLoadStoreBase *)this_01,(ivec4 *)&local_c8,b,
                           (GLenum)_Var4._M_p);
        b = extraout_RDX_00;
        if (!bVar2) {
          tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_40,(Vector<int,_4> *)this_01);
          glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                    (&local_c8,local_40,v);
          _Var1._M_p = local_c8._M_dataplus._M_p;
          local_78 = 5;
          uStack_70 = 0x200000000;
          glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                    (&local_60,(ShaderImageLoadStoreBase *)&local_78,v_00);
          _Var4._M_p = local_60._M_dataplus._M_p;
          anon_unknown_0::Output
                    ("[%d] Check failed. Received: %s instead of: %s \n",uVar7 & 0xffffffff,
                     _Var1._M_p);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_c8);
          bVar6 = 0;
          b = extraout_RDX_01;
        }
        this_01 = this_01 + 2;
      }
      lVar5 = -(ulong)(~bVar6 & 1);
      std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
                (&o_data.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&data.super__Vector_base<float,_std::allocator<float>_>);
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(0, 2) || !IsSSBInVSFSAvailable(1))
			return NOT_SUPPORTED;

		const int		   kSize = 32;
		std::vector<float> data(kSize * kSize * 4);

		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D_ARRAY, m_texture);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_R32F, kSize, kSize, 4);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, kSize, kSize, 4, GL_RED, GL_FLOAT, &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		const char* src_fs =
			NL "#define KSIZE 32" NL "layout(std430) buffer out_data {" NL "  ivec4 o_color[KSIZE*KSIZE];" NL "};" NL
			   "layout(r32f, binding = 0) coherent restrict uniform image2D g_image_layer0;" NL
			   "layout(r32f, binding = 1) volatile uniform image2D g_image_layer1;" NL "void main() {" NL
			   "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL "  imageStore(g_image_layer0, coord, vec4(1.0));" NL
			   "  memoryBarrier();" NL "  imageStore(g_image_layer1, coord, vec4(2.0));" NL "  memoryBarrier();" NL
			   "  imageStore(g_image_layer0, coord, vec4(3.0));" NL "  memoryBarrier();" NL
			   "  int coordIndex = coord.x + KSIZE * coord.y;" NL
			   "  o_color[coordIndex] = ivec4(imageLoad(g_image_layer0, coord) + imageLoad(g_image_layer1, coord));" NL
			   "}";
		m_program = BuildProgram(src_vs, src_fs);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32F);
		glBindImageTexture(1, m_texture, 0, GL_FALSE, 1, GL_READ_WRITE, GL_R32F);

		glClear(GL_COLOR_BUFFER_BIT);
		glViewport(0, 0, kSize, kSize);

		std::vector<ivec4> o_data(kSize * kSize);
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &o_data[0], GL_STATIC_DRAW);

		glUseProgram(m_program);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool status = true;

		ivec4* out_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(out_data[i], ivec4(5, 0, 0, 2), 0))
			{
				status = false;
				Output("[%d] Check failed. Received: %s instead of: %s \n", i, ToString(out_data[i]).c_str(),
					   ToString(ivec4(5, 0, 0, 2)).c_str());
			}
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}